

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxsender.h
# Opt level: O2

void quicly_maxsender_acked(quicly_maxsender_t *m,quicly_maxsender_sent_t *sent)

{
  quicly_maxsender_sent_t qVar1;
  
  qVar1 = *sent;
  if (m->max_acked < (long)((ulong)qVar1 >> 1)) {
    m->max_acked = (ulong)qVar1 >> 1;
    qVar1 = *sent;
  }
  if (((ulong)qVar1 & 1) != 0) {
    if (m->num_inflight == 0) {
      __assert_fail("m->num_inflight != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/maxsender.h"
                    ,0x77,
                    "void quicly_maxsender_acked(quicly_maxsender_t *, quicly_maxsender_sent_t *)");
    }
    m->num_inflight = m->num_inflight - 1;
    *(byte *)sent = *(byte *)sent & 0xfe;
  }
  return;
}

Assistant:

inline void quicly_maxsender_acked(quicly_maxsender_t *m, quicly_maxsender_sent_t *sent)
{
    if (m->max_acked < (int64_t)sent->value)
        m->max_acked = sent->value;
    /* num_inflight should not be adjusted in case of a late ACK */
    if (sent->inflight) {
        assert(m->num_inflight != 0);
        --m->num_inflight;
        sent->inflight = 0;
    }
}